

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsAbstractTableElement.cpp
# Opt level: O0

void __thiscall KDReports::AbstractTableElement::AbstractTableElement(AbstractTableElement *this)

{
  AbstractTableElementPrivate *this_00;
  AbstractTableElement *this_local;
  
  Element::Element(&this->super_Element);
  (this->super_Element)._vptr_Element = (_func_int **)&PTR__AbstractTableElement_001c82d0;
  this_00 = (AbstractTableElementPrivate *)operator_new(0x58);
  AbstractTableElementPrivate::AbstractTableElementPrivate(this_00);
  std::
  unique_ptr<KDReports::AbstractTableElementPrivate,std::default_delete<KDReports::AbstractTableElementPrivate>>
  ::unique_ptr<std::default_delete<KDReports::AbstractTableElementPrivate>,void>
            ((unique_ptr<KDReports::AbstractTableElementPrivate,std::default_delete<KDReports::AbstractTableElementPrivate>>
              *)&this->d,this_00);
  return;
}

Assistant:

KDReports::AbstractTableElement::AbstractTableElement()
    : Element()
    , d(new AbstractTableElementPrivate)
{
}